

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,IfStmt *stmt)

{
  bool bVar1;
  uint32_t uVar2;
  StatementType SVar3;
  element_type *peVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  StmtBlock *pSVar9;
  element_type *peVar10;
  uint64_t uVar11;
  element_type *peVar12;
  element_type *peVar13;
  string_view __str;
  bool local_129;
  bool local_121;
  undefined1 local_d0 [24];
  pointer local_b8;
  bool local_a9;
  undefined1 local_a8 [7];
  bool skip;
  shared_ptr<kratos::Stmt> first_stmt;
  shared_ptr<kratos::ScopedStmtBlock> *else_body;
  shared_ptr<kratos::ScopedStmtBlock> *then_body;
  undefined1 local_78 [16];
  string local_68;
  string_view local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  IfStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_28._16_8_ = stmt;
  stmt_local = (IfStmt *)this;
  if ((this->generator_->debug & 1U) != 0) {
    uVar2 = Stream::line_no(&this->stream_);
    (((Stmt *)local_28._16_8_)->super_IRNode).verilog_ln = uVar2;
    IfStmt::predicate((IfStmt *)local_28);
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    uVar2 = (peVar4->super_IRNode).verilog_ln;
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_28);
    if (uVar2 == 0) {
      uVar2 = Stream::line_no(&this->stream_);
      IfStmt::predicate((IfStmt *)local_38);
      peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      (peVar4->super_IRNode).verilog_ln = uVar2;
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_38);
    }
  }
  local_48 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_48);
  poVar6 = std::operator<<(pbVar5,"if (");
  IfStmt::predicate((IfStmt *)local_78);
  Stream::var_str_abi_cxx11_
            ((string *)(local_78 + 0x10),&this->stream_,(shared_ptr<kratos::Var> *)local_78);
  poVar6 = std::operator<<(poVar6,(string *)(local_78 + 0x10));
  std::operator<<(poVar6,") ");
  std::__cxx11::string::~string((string *)(local_78 + 0x10));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_78);
  p_Var7 = &IfStmt::then_body((IfStmt *)local_28._16_8_)->
            super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
  peVar8 = std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(p_Var7);
  (**this->_vptr_SystemVerilogCodeGen)(this,peVar8);
  first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IfStmt::else_body((IfStmt *)local_28._16_8_);
  pSVar9 = &std::
            __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->super_StmtBlock;
  bVar1 = StmtBlock::empty(pSVar9);
  if (!bVar1) {
    pSVar9 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)first_stmt.
                              super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->super_StmtBlock;
    bVar1 = StmtBlock::empty(pSVar9);
    if (bVar1) {
      std::shared_ptr<kratos::Stmt>::shared_ptr((shared_ptr<kratos::Stmt> *)local_a8,(nullptr_t)0x0)
      ;
    }
    else {
      peVar10 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)first_stmt.
                                super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
      StmtBlock::get_stmt((StmtBlock *)local_a8,(uint64_t)peVar10);
    }
    pSVar9 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)first_stmt.
                              super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->super_StmtBlock;
    uVar11 = StmtBlock::size(pSVar9);
    local_121 = false;
    if (uVar11 == 1) {
      peVar12 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_a8);
      SVar3 = Stmt::type(peVar12);
      local_129 = true;
      if (SVar3 != Assign) {
        peVar12 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a8);
        SVar3 = Stmt::type(peVar12);
        local_129 = true;
        if (SVar3 != If) {
          peVar12 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_a8);
          SVar3 = Stmt::type(peVar12);
          local_129 = SVar3 == Return;
        }
      }
      local_121 = local_129;
    }
    local_a9 = local_121;
    if (local_121 == false) {
      __str = indent(this);
      pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               &(this->stream_).super_stringstream.field_0x10,__str);
      std::operator<<(pbVar5,"else ");
      p_Var7 = &IfStmt::else_body((IfStmt *)local_28._16_8_)->
                super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
      peVar8 = std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(p_Var7);
      (**this->_vptr_SystemVerilogCodeGen)(this,peVar8);
    }
    else {
      join_0x00000010_0x00000000_ = indent(this);
      pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               &(this->stream_).super_stringstream.field_0x10,
                               join_0x00000010_0x00000000_);
      std::operator<<(pbVar5,"else ");
      this->skip_indent_ = true;
      uVar2 = Stream::line_no(&this->stream_);
      peVar10 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)first_stmt.
                                super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
      (peVar10->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln = uVar2;
      peVar10 = std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)first_stmt.
                               super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      StmtBlock::operator[]((StmtBlock *)local_d0,(uint32_t)peVar10);
      peVar13 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
      (**this->_vptr_SystemVerilogCodeGen)(this,peVar13);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_d0);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_a8);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(IfStmt* stmt) {
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
        if (stmt->predicate()->verilog_ln == 0) stmt->predicate()->verilog_ln = stream_.line_no();
    }
    stream_ << indent() << "if (" << stream_.var_str(stmt->predicate()) << ") ";
    auto const& then_body = stmt->then_body();
    dispatch_node(then_body.get());

    auto const& else_body = stmt->else_body();
    if (!else_body->empty()) {
        // special case where there is another (and only) if statement nested inside the else body
        // i.e. the else if case
        auto first_stmt = else_body->empty() ? nullptr : else_body->get_stmt(0);
        bool skip = else_body->size() == 1 && (first_stmt->type() == StatementType::Assign ||
                                               first_stmt->type() == StatementType::If ||
                                               first_stmt->type() == StatementType::Return);
        if (skip) {
            stream_ << indent() << "else ";
            skip_indent_ = true;
            else_body->verilog_ln = stream_.line_no();
            dispatch_node((*else_body)[0].get());
        } else {
            stream_ << indent() << "else ";
            dispatch_node(stmt->else_body().get());
        }
    }
}